

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_list_un_complete_tasks.cc
# Opt level: O0

void anon_unknown.dwarf_6320c::Json2Type(Value *value,DrdsListUnCompleteTaskstaskType *item)

{
  bool bVar1;
  Int IVar2;
  Value *pVVar3;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  DrdsListUnCompleteTaskstaskType *local_18;
  DrdsListUnCompleteTaskstaskType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (DrdsListUnCompleteTaskstaskType *)value;
  bVar1 = Json::Value::isMember(value,"RequestId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"RequestId");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar3);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TargetId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"TargetId");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->target_id,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TaskDetail");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"TaskDetail");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->task_detail,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"taskStatus");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"taskStatus");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->task_status = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TaskPhase");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"TaskPhase");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->task_phase,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TaskType");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"TaskType");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->task_type = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TaskName");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"TaskName");
    Json::Value::asString_abi_cxx11_(&local_b8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->task_name,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"gmtCreate");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"gmtCreate");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->gmt_create = (long)IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"AllowCancel");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"AllowCancel");
    Json::Value::asString_abi_cxx11_(&local_d8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->allow_cancel,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ErrMsg");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ErrMsg");
    Json::Value::asString_abi_cxx11_(&local_f8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->err_msg,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, DrdsListUnCompleteTaskstaskType* item) {
  if(value.isMember("RequestId")) {
    item->request_id = value["RequestId"].asString();
  }
  if(value.isMember("TargetId")) {
    item->target_id = value["TargetId"].asString();
  }
  if(value.isMember("TaskDetail")) {
    item->task_detail = value["TaskDetail"].asString();
  }
  if(value.isMember("taskStatus")) {
    item->task_status = value["taskStatus"].asInt();
  }
  if(value.isMember("TaskPhase")) {
    item->task_phase = value["TaskPhase"].asString();
  }
  if(value.isMember("TaskType")) {
    item->task_type = value["TaskType"].asInt();
  }
  if(value.isMember("TaskName")) {
    item->task_name = value["TaskName"].asString();
  }
  if(value.isMember("gmtCreate")) {
    item->gmt_create = value["gmtCreate"].asInt();
  }
  if(value.isMember("AllowCancel")) {
    item->allow_cancel = value["AllowCancel"].asString();
  }
  if(value.isMember("ErrMsg")) {
    item->err_msg = value["ErrMsg"].asString();
  }
}